

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<int,kj::String>::Callbacks>::find<kj::HashMap<int,kj::String>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table,int *params)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  uint *in_R8;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  uVar2 = table.ptr[1].content.size_;
  if (uVar2 == 0) {
    *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  uVar1 = *in_R8;
  uVar5 = uVar1 * 0x8000 + ~uVar1;
  uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
  uVar6 = (uVar5 >> 4 ^ uVar5) * 0x809;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  uVar7 = (ulong)((int)uVar2 - 1U & uVar6);
  pcVar3 = table.ptr[1].content.ptr;
  uVar5 = *(uint *)(pcVar3 + uVar7 * 8 + 4);
  if (uVar5 != 0) {
    puVar4 = (uint *)(pcVar3 + uVar7 * 8);
    do {
      if (((uVar5 != 1) && (*puVar4 == uVar6)) &&
         (*(uint *)(MVar9.ptr.field_1.value + (ulong)(uVar5 - 2) * 0x20) == uVar1)) {
        *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
        goto LAB_00178ca8;
      }
      uVar8 = uVar7 + 1;
      uVar7 = uVar8 & 0xffffffff;
      if (uVar8 == uVar2) {
        uVar7 = 0;
      }
      puVar4 = (uint *)(pcVar3 + uVar7 * 8);
      uVar5 = puVar4[1];
    } while (uVar5 != 0);
  }
  *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x0;
LAB_00178ca8:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }